

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtDbvt.h
# Opt level: O2

void cbtDbvt::rayTest(cbtDbvtNode *root,cbtVector3 *rayFrom,cbtVector3 *rayTo,ICollide *policy)

{
  cbtDbvtNode *pcVar1;
  ulong uVar2;
  undefined8 uVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  undefined1 auVar8 [16];
  undefined1 auVar10 [16];
  undefined1 in_ZMM0 [64];
  undefined1 auVar13 [56];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar14 [16];
  undefined1 in_ZMM1 [64];
  undefined1 auVar17 [56];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  cbtVector3 cVar18;
  cbtScalar tmin;
  cbtAlignedObjectArray<const_cbtDbvtNode_*> stack;
  cbtDbvtNode *local_4a0;
  undefined8 local_498;
  uint local_490;
  cbtVector3 rayDirectionInverse;
  cbtScalar local_478;
  cbtVector3 bounds [2];
  cbtVector3 rayDir;
  char tempmemory [1024];
  undefined1 auVar9 [16];
  
  auVar17 = in_ZMM1._8_56_;
  auVar13 = in_ZMM0._8_56_;
  if (root != (cbtDbvtNode *)0x0) {
    cVar18 = ::operator-(rayTo,rayFrom);
    auVar15._0_8_ = cVar18.m_floats._8_8_;
    auVar15._8_56_ = auVar17;
    auVar11._0_8_ = cVar18.m_floats._0_8_;
    auVar11._8_56_ = auVar13;
    rayDir.m_floats = (cbtScalar  [4])vmovlhps_avx(auVar11._0_16_,auVar15._0_16_);
    cbtVector3::normalize(&rayDir);
    cVar18.m_floats = rayDir.m_floats;
    auVar14._8_4_ = 0x3f800000;
    auVar14._0_8_ = 0x3f8000003f800000;
    auVar14._12_4_ = 0x3f800000;
    auVar10._8_8_ = 0;
    auVar10._0_4_ = rayDir.m_floats[0];
    auVar10._4_4_ = rayDir.m_floats[1];
    uVar2 = vcmpps_avx512vl(auVar10,ZEXT816(0) << 0x40,0);
    auVar10 = vdivps_avx(auVar14,auVar10);
    rayDir.m_floats[2] = cVar18.m_floats[2];
    auVar17 = (undefined1  [56])0x0;
    auVar8 = vbroadcastss_avx512vl(ZEXT416(0x5d5e0b6b));
    bVar4 = (bool)((byte)uVar2 & 1);
    auVar9._0_4_ = (uint)bVar4 * auVar8._0_4_ | (uint)!bVar4 * auVar10._0_4_;
    bVar4 = (bool)((byte)(uVar2 >> 1) & 1);
    auVar9._4_4_ = (uint)bVar4 * auVar8._4_4_ | (uint)!bVar4 * auVar10._4_4_;
    bVar4 = (bool)((byte)(uVar2 >> 2) & 1);
    auVar9._8_4_ = (uint)bVar4 * auVar8._8_4_ | (uint)!bVar4 * auVar10._8_4_;
    bVar4 = (bool)((byte)(uVar2 >> 3) & 1);
    auVar9._12_4_ = (uint)bVar4 * auVar8._12_4_ | (uint)!bVar4 * auVar10._12_4_;
    uVar3 = vcmpss_avx512f(ZEXT416((uint)rayDir.m_floats[2]),ZEXT816(0) << 0x40,0);
    bVar4 = (bool)((byte)uVar3 & 1);
    rayDirectionInverse.m_floats[2] =
         (cbtScalar)((uint)bVar4 * 0x5d5e0b6b + (uint)!bVar4 * (int)(1.0 / rayDir.m_floats[2]));
    rayDirectionInverse.m_floats._0_8_ = vmovlps_avx(auVar9);
    auVar10 = vcmpps_avx(auVar9,ZEXT816(0) << 0x40,1);
    auVar8._8_4_ = 1;
    auVar8._0_8_ = 0x100000001;
    auVar8._12_4_ = 1;
    auVar10 = vandps_avx512vl(auVar10,auVar8);
    auVar13 = ZEXT856(auVar10._8_8_);
    local_498 = vmovlps_avx(auVar10);
    local_490 = (uint)(rayDirectionInverse.m_floats[2] < 0.0);
    rayDir.m_floats = cVar18.m_floats;
    cVar18 = ::operator-(rayTo,rayFrom);
    auVar16._0_8_ = cVar18.m_floats._8_8_;
    auVar16._8_56_ = auVar17;
    auVar12._0_8_ = cVar18.m_floats._0_8_;
    auVar12._8_56_ = auVar13;
    auVar10 = vmovshdup_avx(auVar12._0_16_);
    stack.m_ownsMemory = true;
    stack.m_data = (cbtDbvtNode **)0x0;
    stack.m_size = 0;
    stack.m_capacity = 0;
    auVar10 = vfmadd231ss_fma(ZEXT416((uint)(auVar10._0_4_ * rayDir.m_floats[1])),auVar12._0_16_,
                              ZEXT416((uint)rayDir.m_floats[0]));
    auVar10 = vfmadd132ss_fma(auVar16._0_16_,auVar10,ZEXT416((uint)rayDir.m_floats[2]));
    cbtAlignedObjectArray<const_cbtDbvtNode_*>::initializeFromBuffer(&stack,tempmemory,0x80,0x80);
    *stack.m_data = root;
    iVar5 = 0x7e;
    iVar6 = 1;
    do {
      pcVar1 = stack.m_data[(long)iVar6 + -1];
      bounds[0].m_floats._0_8_ = *(undefined8 *)(pcVar1->volume).mi.m_floats;
      bounds[0].m_floats._8_8_ = *(undefined8 *)((pcVar1->volume).mi.m_floats + 2);
      bounds[1].m_floats._0_8_ = *(undefined8 *)(pcVar1->volume).mx.m_floats;
      bounds[1].m_floats._8_8_ = *(undefined8 *)((pcVar1->volume).mx.m_floats + 2);
      tmin = 1.0;
      local_478 = auVar10._0_4_;
      bVar4 = cbtRayAabb2(rayFrom,&rayDirectionInverse,(uint *)&local_498,bounds,&tmin,0.0,local_478
                         );
      iVar7 = iVar6 + -1;
      if (bVar4) {
        if ((pcVar1->field_2).childs[1] == (cbtDbvtNode *)0x0) {
          (*policy->_vptr_ICollide[3])(policy,pcVar1);
        }
        else {
          if (iVar5 < iVar7) {
            local_4a0 = (cbtDbvtNode *)0x0;
            cbtAlignedObjectArray<const_cbtDbvtNode_*>::resize(&stack,stack.m_size * 2,&local_4a0);
            iVar5 = stack.m_size + -2;
          }
          iVar7 = iVar6 + 1;
          stack.m_data[(long)iVar6 + -1] = (pcVar1->field_2).childs[0];
          stack.m_data[iVar6] = (pcVar1->field_2).childs[1];
        }
      }
      iVar6 = iVar7;
    } while (iVar7 != 0);
    cbtAlignedObjectArray<const_cbtDbvtNode_*>::~cbtAlignedObjectArray(&stack);
  }
  return;
}

Assistant:

DBVT_PREFIX
inline void cbtDbvt::rayTest(const cbtDbvtNode* root,
							const cbtVector3& rayFrom,
							const cbtVector3& rayTo,
							DBVT_IPOLICY)
{
	DBVT_CHECKTYPE
	if (root)
	{
		cbtVector3 rayDir = (rayTo - rayFrom);
		rayDir.normalize();

		///what about division by zero? --> just set rayDirection[i] to INF/BT_LARGE_FLOAT
		cbtVector3 rayDirectionInverse;
		rayDirectionInverse[0] = rayDir[0] == cbtScalar(0.0) ? cbtScalar(BT_LARGE_FLOAT) : cbtScalar(1.0) / rayDir[0];
		rayDirectionInverse[1] = rayDir[1] == cbtScalar(0.0) ? cbtScalar(BT_LARGE_FLOAT) : cbtScalar(1.0) / rayDir[1];
		rayDirectionInverse[2] = rayDir[2] == cbtScalar(0.0) ? cbtScalar(BT_LARGE_FLOAT) : cbtScalar(1.0) / rayDir[2];
		unsigned int signs[3] = {rayDirectionInverse[0] < 0.0, rayDirectionInverse[1] < 0.0, rayDirectionInverse[2] < 0.0};

		cbtScalar lambda_max = rayDir.dot(rayTo - rayFrom);

		cbtVector3 resultNormal;

		cbtAlignedObjectArray<const cbtDbvtNode*> stack;

		int depth = 1;
		int treshold = DOUBLE_STACKSIZE - 2;

		char tempmemory[DOUBLE_STACKSIZE * sizeof(const cbtDbvtNode*)];
#ifndef BT_DISABLE_STACK_TEMP_MEMORY
		stack.initializeFromBuffer(tempmemory, DOUBLE_STACKSIZE, DOUBLE_STACKSIZE);
#else   //BT_DISABLE_STACK_TEMP_MEMORY
		stack.resize(DOUBLE_STACKSIZE);
#endif  //BT_DISABLE_STACK_TEMP_MEMORY
		stack[0] = root;
		cbtVector3 bounds[2];
		do
		{
			const cbtDbvtNode* node = stack[--depth];

			bounds[0] = node->volume.Mins();
			bounds[1] = node->volume.Maxs();

			cbtScalar tmin = 1.f, lambda_min = 0.f;
			unsigned int result1 = cbtRayAabb2(rayFrom, rayDirectionInverse, signs, bounds, tmin, lambda_min, lambda_max);

#ifdef COMPARE_BTRAY_AABB2
			cbtScalar param = 1.f;
			bool result2 = cbtRayAabb(rayFrom, rayTo, node->volume.Mins(), node->volume.Maxs(), param, resultNormal);
			cbtAssert(result1 == result2);
#endif  //TEST_BTRAY_AABB2

			if (result1)
			{
				if (node->isinternal())
				{
					if (depth > treshold)
					{
						stack.resize(stack.size() * 2);
						treshold = stack.size() - 2;
					}
					stack[depth++] = node->childs[0];
					stack[depth++] = node->childs[1];
				}
				else
				{
					policy.Process(node);
				}
			}
		} while (depth);
	}
}